

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_app.cpp
# Opt level: O3

bool Clasp::Cli::ClaspAppBase::parsePositional(string *t,string *out)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *end;
  int num;
  char *local_18;
  int local_c;
  
  iVar1 = Potassco::xconvert((t->_M_dataplus)._M_p,&local_c,&local_18,0);
  if ((iVar1 == 0) || (*local_18 != '\0')) {
    pcVar3 = (char *)out->_M_string_length;
    pcVar2 = "file";
  }
  else {
    pcVar3 = (char *)out->_M_string_length;
    pcVar2 = "number";
  }
  std::__cxx11::string::_M_replace((ulong)out,0,pcVar3,(ulong)pcVar2);
  return true;
}

Assistant:

bool ClaspAppBase::parsePositional(const std::string& t, std::string& out) {
	int num;
	if (Potassco::string_cast(t, num)) { out = "number"; }
	else                               { out = "file";   }
	return true;
}